

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall GlobalSimpleStringMemoryAccountant::stop(GlobalSimpleStringMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  AccountingTestMemoryAllocator *pAVar3;
  
  if (this->allocator_ == (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Global SimpleString allocator stopped without starting",
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
               ,0x57,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)SimpleString::getStringAllocator();
  if (pAVar3 != this->allocator_) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,
               "GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
               ,0x5a,pTVar2);
  }
  restoreAllocator(this);
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::stop()
{
    if (allocator_ == NULLPTR)
        FAIL("Global SimpleString allocator stopped without starting");

    if (SimpleString::getStringAllocator() != allocator_)
      FAIL("GlobalStrimpleStringMemoryAccountant: allocator has changed between start and stop!");

    restoreAllocator();
}